

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int sqlite3_vtab_rhs_value(sqlite3_index_info *pIdxInfo,int iCons,sqlite3_value **ppVal)

{
  WhereTerm *pTerm;
  sqlite3_value *psStack_30;
  int rc;
  sqlite3_value *pVal;
  HiddenIndexInfo *pH;
  sqlite3_value **ppVal_local;
  int iCons_local;
  sqlite3_index_info *pIdxInfo_local;
  
  psStack_30 = (sqlite3_value *)0x0;
  pTerm._4_4_ = 0;
  if ((iCons < 0) || (pIdxInfo->nConstraint <= iCons)) {
    pTerm._4_4_ = 0x15;
  }
  else {
    if ((&pIdxInfo[1].aConstraintUsage)[iCons] == (sqlite3_index_constraint_usage *)0x0) {
      pTerm._4_4_ = sqlite3ValueFromExpr
                              (*(sqlite3 **)pIdxInfo[1].aConstraint,
                               *(Expr **)(*(long *)(*(long *)(*(long *)(pIdxInfo + 1) + 0x20) +
                                                   (long)pIdxInfo->aConstraint[iCons].iTermOffset *
                                                   0x38) + 0x18),
                               *(u8 *)(*(long *)pIdxInfo[1].aConstraint + 100),'A',
                               (sqlite3_value **)(&pIdxInfo[1].aConstraintUsage + iCons));
    }
    psStack_30 = (sqlite3_value *)(&pIdxInfo[1].aConstraintUsage)[iCons];
  }
  *ppVal = psStack_30;
  if ((pTerm._4_4_ == 0) && (psStack_30 == (sqlite3_value *)0x0)) {
    pTerm._4_4_ = 0xc;
  }
  return pTerm._4_4_;
}

Assistant:

SQLITE_API int sqlite3_vtab_rhs_value(
  sqlite3_index_info *pIdxInfo,   /* Copy of first argument to xBestIndex */
  int iCons,                      /* Constraint for which RHS is wanted */
  sqlite3_value **ppVal           /* Write value extracted here */
){
  HiddenIndexInfo *pH = (HiddenIndexInfo*)&pIdxInfo[1];
  sqlite3_value *pVal = 0;
  int rc = SQLITE_OK;
  if( iCons<0 || iCons>=pIdxInfo->nConstraint ){
    rc = SQLITE_MISUSE; /* EV: R-30545-25046 */
  }else{
    if( pH->aRhs[iCons]==0 ){
      WhereTerm *pTerm = &pH->pWC->a[pIdxInfo->aConstraint[iCons].iTermOffset];
      rc = sqlite3ValueFromExpr(
          pH->pParse->db, pTerm->pExpr->pRight, ENC(pH->pParse->db),
          SQLITE_AFF_BLOB, &pH->aRhs[iCons]
      );
      testcase( rc!=SQLITE_OK );
    }
    pVal = pH->aRhs[iCons];
  }
  *ppVal = pVal;

  if( rc==SQLITE_OK && pVal==0 ){  /* IMP: R-19933-32160 */
    rc = SQLITE_NOTFOUND;          /* IMP: R-36424-56542 */
  }

  return rc;
}